

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_get_mi_info(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  long lVar5;
  uint *in_RSI;
  long in_RDI;
  int offset;
  int mi_stride;
  int mi_cols;
  int mi_rows;
  AV1_COMMON *cm;
  FrameWorkerData *frame_worker_data;
  MB_MODE_INFO *mi;
  int mi_col;
  int mi_row;
  undefined8 *local_90;
  int *local_78;
  int *local_60;
  aom_codec_err_t local_4;
  
  uVar1 = *in_RSI;
  if (uVar1 < 0x29) {
    local_60 = (int *)((long)(int)uVar1 + *(long *)(in_RSI + 4));
    *in_RSI = uVar1 + 8;
  }
  else {
    local_60 = *(int **)(in_RSI + 2);
    *(int **)(in_RSI + 2) = local_60 + 2;
  }
  iVar2 = *local_60;
  uVar1 = *in_RSI;
  if (uVar1 < 0x29) {
    local_78 = (int *)((long)(int)uVar1 + *(long *)(in_RSI + 4));
    *in_RSI = uVar1 + 8;
  }
  else {
    local_78 = *(int **)(in_RSI + 2);
    *(int **)(in_RSI + 2) = local_78 + 2;
  }
  iVar3 = *local_78;
  uVar1 = *in_RSI;
  if (uVar1 < 0x29) {
    local_90 = (undefined8 *)((long)(int)uVar1 + *(long *)(in_RSI + 4));
    *in_RSI = uVar1 + 8;
  }
  else {
    local_90 = *(undefined8 **)(in_RSI + 2);
    *(undefined8 **)(in_RSI + 2) = local_90 + 1;
  }
  if ((void *)*local_90 == (void *)0x0) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else if (*(long *)(in_RDI + 0x69f0) == 0) {
    local_4 = AOM_CODEC_ERROR;
  }
  else {
    plVar4 = *(long **)(*(long *)(in_RDI + 0x69f0) + 0x20);
    if (plVar4 == (long *)0x0) {
      local_4 = AOM_CODEC_ERROR;
    }
    else {
      lVar5 = *plVar4;
      if ((((iVar2 < 0) || (*(int *)(lVar5 + 0x3d74) <= iVar2)) || (iVar3 < 0)) ||
         (*(int *)(lVar5 + 0x3d78) <= iVar3)) {
        local_4 = AOM_CODEC_INVALID_PARAM;
      }
      else {
        memcpy((void *)*local_90,
               *(void **)(*(long *)(lVar5 + 0x3d98) +
                         (long)(iVar2 * *(int *)(lVar5 + 0x3da4) + iVar3) * 8),0xb0);
        local_4 = AOM_CODEC_OK;
      }
    }
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_get_mi_info(aom_codec_alg_priv_t *ctx,
                                        va_list args) {
  int mi_row = va_arg(args, int);
  int mi_col = va_arg(args, int);
  MB_MODE_INFO *mi = va_arg(args, MB_MODE_INFO *);
  if (mi == NULL) return AOM_CODEC_INVALID_PARAM;
  if (ctx->frame_worker == NULL) return AOM_CODEC_ERROR;
  FrameWorkerData *const frame_worker_data =
      (FrameWorkerData *)ctx->frame_worker->data1;
  if (frame_worker_data == NULL) return AOM_CODEC_ERROR;

  AV1_COMMON *cm = &frame_worker_data->pbi->common;
  const int mi_rows = cm->mi_params.mi_rows;
  const int mi_cols = cm->mi_params.mi_cols;
  const int mi_stride = cm->mi_params.mi_stride;
  const int offset = mi_row * mi_stride + mi_col;

  if (mi_row < 0 || mi_row >= mi_rows || mi_col < 0 || mi_col >= mi_cols) {
    return AOM_CODEC_INVALID_PARAM;
  }

  memcpy(mi, cm->mi_params.mi_grid_base[offset], sizeof(*mi));

  return AOM_CODEC_OK;
}